

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  __type _Var1;
  size_type sVar2;
  ulong local_30;
  size_t i;
  size_t *retIdx_local;
  string *key_local;
  UniValue *this_local;
  
  local_30 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->keys);
    if (sVar2 <= local_30) {
      return false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->keys,local_30);
    _Var1 = std::operator==(key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )retIdx);
    if (_Var1) break;
    local_30 = local_30 + 1;
  }
  *retIdx = local_30;
  return true;
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}